

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall glslang::TSymbol::setExtensions(TSymbol *this,int numExts,char **exts)

{
  uint __line;
  TVector<const_char_*> *pTVar1;
  char *__assertion;
  ulong uVar2;
  bool bVar3;
  
  if (this->extensions == (TExtensionList *)0x0) {
    uVar2 = (ulong)(uint)numExts;
    if (0 < numExts) {
      pTVar1 = NewPoolObject<glslang::TVector<char_const*>>((TVector<const_char_*> *)0x0);
      this->extensions = pTVar1;
      while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
        std::vector<const_char_*,_glslang::pool_allocator<const_char_*>_>::push_back
                  (&this->extensions->
                    super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>,exts);
        exts = exts + 1;
      }
      return;
    }
    __assertion = "numExts > 0";
    __line = 0x71;
  }
  else {
    __assertion = "extensions == nullptr";
    __line = 0x70;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,__line,"virtual void glslang::TSymbol::setExtensions(int, const char *const *)");
}

Assistant:

virtual void setExtensions(int numExts, const char* const exts[])
    {
        assert(extensions == nullptr);
        assert(numExts > 0);
        extensions = NewPoolObject(extensions);
        for (int e = 0; e < numExts; ++e)
            extensions->push_back(exts[e]);
    }